

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_lemire2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  size_t i;
  long lVar3;
  size_t i_1;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 local_68 [72];
  
  auVar2 = _DAT_00119080;
  if (len < 0x40) {
    if (len != 0) {
      auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
      auVar9 = vpmovsxbd_avx512f(_DAT_00116080);
      auVar10 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        auVar11 = vpbroadcastd_avx512f();
        auVar11 = vpsrlvd_avx512f(auVar11,auVar9);
        auVar11 = vpandd_avx512f(auVar11,auVar10);
        auVar8 = vpaddd_avx512f(auVar11,auVar8);
      } while (len != uVar4);
      auVar8 = vmovdqu64_avx512f(auVar8);
      *(undefined1 (*) [64])flags = auVar8;
    }
  }
  else {
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    lVar3 = 1;
    do {
      auVar12 = vpand_avx2(_DAT_00119080,*(undefined1 (*) [32])(local_68 + lVar3 * 2));
      lVar3 = lVar3 + 1;
      auVar12 = vpcmpeqw_avx2(auVar12,_DAT_00119080);
      auVar12 = vpsubw_avx2(auVar8._0_32_,auVar12);
      auVar8 = ZEXT3264(auVar12);
    } while (lVar3 != 0x10);
    uVar4 = (ulong)len;
    lVar3 = 1;
    do {
      auVar12 = vpand_avx2(_DAT_00119080,*(undefined1 (*) [32])(local_68 + lVar3 * 2));
      lVar3 = lVar3 + 1;
      auVar12 = vpcmpeqw_avx2(auVar12,_DAT_00119080);
      auVar12 = vpsubw_avx2(auVar8._0_32_,auVar12);
      auVar8 = ZEXT3264(auVar12);
    } while (lVar3 != 0x10);
    auVar8 = vpmovzxwd_avx512f(auVar12);
    auVar9 = vpaddd_avx512f(auVar8,*(undefined1 (*) [64])flags);
    lVar3 = 0;
    auVar8 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])flags = auVar8;
    do {
      uVar6 = (uVar4 - 0xf) - lVar3;
      if (lVar3 + 0x1000fU < uVar4) {
        uVar6 = 0xffff;
      }
      if (uVar6 < 9) {
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        uVar5 = 0;
      }
      else {
        uVar5 = uVar6 & 0xfffffffffffffff8;
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        uVar7 = 0;
        do {
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar8._0_32_,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 1));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 2));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 3));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 4));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 5));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 6));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar7 + 7));
          uVar7 = uVar7 + 8;
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar12 = vpsubw_avx2(auVar1,auVar12);
          auVar8 = ZEXT3264(auVar12);
        } while (uVar7 < uVar6 - 7);
      }
      if ((uVar5 | 3) < uVar6 && 4 < uVar6) {
        uVar7 = uVar5 + 3;
        do {
          uVar5 = uVar7;
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + (uVar5 - 3)));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar8._0_32_,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + (uVar5 - 2)));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + (uVar5 - 1)));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar1 = vpsubw_avx2(auVar1,auVar12);
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar5));
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar12 = vpsubw_avx2(auVar1,auVar12);
          auVar8 = ZEXT3264(auVar12);
          uVar7 = uVar5 + 4;
        } while (uVar5 + 4 < uVar6);
        uVar5 = uVar5 + 1;
      }
      auVar12 = auVar8._0_32_;
      uVar7 = uVar5;
      if (uVar5 < uVar6) {
        do {
          auVar12 = vpand_avx2(auVar2,*(undefined1 (*) [32])(array + lVar3 + uVar5));
          uVar5 = uVar5 + 1;
          auVar12 = vpcmpeqw_avx2(auVar12,auVar2);
          auVar12 = vpsubw_avx2(auVar8._0_32_,auVar12);
          auVar8 = ZEXT3264(auVar12);
          uVar7 = uVar6;
        } while (uVar6 != uVar5);
      }
      auVar8 = vpmovzxwd_avx512f(auVar12);
      uVar6 = uVar7 + 0x10 + lVar3;
      lVar3 = lVar3 + uVar7;
      auVar9 = vpaddd_avx512f(auVar9,auVar8);
      auVar8 = vmovdqu64_avx512f(auVar9);
      *(undefined1 (*) [64])flags = auVar8;
    } while (uVar6 <= uVar4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256, 
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        if (maxj > 8) {
            for (/**/; j < maxj - 7; j += 8) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
                __m256i input5 = _mm256_loadu_si256((__m256i*)(array + i + j + 4));
                __m256i m5  = _mm256_and_si256(input5, bits);
                __m256i eq5 = _mm256_cmpeq_epi16(bits, m5);
                count16 = _mm256_sub_epi16(count16, eq5);
                __m256i input6 = _mm256_loadu_si256((__m256i*)(array + i + j + 5));
                __m256i m6  = _mm256_and_si256(input6, bits);
                __m256i eq6 = _mm256_cmpeq_epi16(bits, m6);
                count16 = _mm256_sub_epi16(count16, eq6);
                __m256i input7 = _mm256_loadu_si256((__m256i*)(array + i + j + 6));
                __m256i m7  = _mm256_and_si256(input7, bits);
                __m256i eq7 = _mm256_cmpeq_epi16(bits, m7);
                count16 = _mm256_sub_epi16(count16, eq7);
                __m256i input8 = _mm256_loadu_si256((__m256i*)(array + i + j + 7));
                __m256i m8  = _mm256_and_si256(input8, bits);
                __m256i eq8 = _mm256_cmpeq_epi16(bits, m8);
                count16 = _mm256_sub_epi16(count16, eq8);
            }
        }

        if (maxj > 4) {
            for (/**/; j + 3 < maxj; j += 4) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
            }
        }
        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;

        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}